

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

mraa_uart_context mraa_uart_init(int index)

{
  mraa_pin_t meta;
  mraa_pin_t meta_00;
  mraa_boolean_t mVar1;
  mraa_result_t mVar2;
  undefined8 in_stack_fffffffffffffefc;
  mraa_result_t ret;
  mraa_uart_context dev;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined1 local_80 [8];
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined4 local_20;
  int local_18;
  uint local_14;
  int pos;
  int index_local;
  
  local_14 = index;
  if (plat == (mraa_board_t *)0x0) {
    syslog(3,"uart%i: init: platform not initialised",(ulong)(uint)index);
    _pos = (mraa_uart_context)0x0;
  }
  else {
    mVar1 = mraa_is_sub_platform_id(index);
    if (mVar1 == 0) {
      if (((plat->adv_func == (mraa_adv_func_t *)0x0) ||
          (plat->adv_func->uart_init_pre == (_func_mraa_result_t_int *)0x0)) ||
         (mVar2 = (*plat->adv_func->uart_init_pre)(local_14), mVar2 == MRAA_SUCCESS)) {
        if (plat->uart_dev_count == 0) {
          syslog(3,"uart%i: init: platform has no UARTs defined",(ulong)local_14);
          _pos = (mraa_uart_context)0x0;
        }
        else if ((int)local_14 < plat->uart_dev_count) {
          if (plat->no_bus_mux == 0) {
            local_18 = plat->uart_dev[(int)local_14].rx;
            if ((-1 < local_18) && (plat->pins[local_18].uart.mux_total != 0)) {
              memcpy(local_80,&plat->pins[local_18].uart,100);
              meta.mux_total = (undefined4)local_70;
              meta.mux[0].pincmd = local_70._4_4_;
              meta.pinmap = (undefined4)uStack_78;
              meta.parent_id = uStack_78._4_4_;
              meta.mux[0].pin = (undefined4)uStack_68;
              meta.mux[0].value = uStack_68._4_4_;
              meta.mux[1].pincmd = (undefined4)local_60;
              meta.mux[1].pin = local_60._4_4_;
              meta.mux[1].value = (undefined4)uStack_58;
              meta.mux[2].pincmd = uStack_58._4_4_;
              meta.mux[2].pin = (undefined4)local_50;
              meta.mux[2].value = local_50._4_4_;
              meta.mux[3].pincmd = (undefined4)uStack_48;
              meta.mux[3].pin = uStack_48._4_4_;
              meta.mux[3].value = (undefined4)local_40;
              meta.mux[4].pincmd = local_40._4_4_;
              meta.mux[4].pin = (undefined4)uStack_38;
              meta.mux[4].value = uStack_38._4_4_;
              meta.mux[5].pincmd = (undefined4)local_30;
              meta.mux[5].pin = local_30._4_4_;
              meta.mux[5].value = (undefined4)uStack_28;
              meta.output_enable = uStack_28._4_4_;
              meta.complex_cap = (mraa_pin_cap_complex_t)local_20;
              meta.gpio_chip = (int)in_stack_fffffffffffffefc;
              meta.gpio_line = (int)((ulong)in_stack_fffffffffffffefc >> 0x20);
              mVar2 = mraa_setup_mux_mapped(meta);
              if (mVar2 != MRAA_SUCCESS) {
                syslog(3,"uart%i: init: failed to setup muxes for RX pin",(ulong)local_14);
                return (mraa_uart_context)0x0;
              }
            }
            local_18 = plat->uart_dev[(int)local_14].tx;
            if ((-1 < local_18) && (plat->pins[local_18].uart.mux_total != 0)) {
              memcpy(&dev,&plat->pins[local_18].uart,100);
              meta_00.mux_total = (undefined4)local_d8;
              meta_00.mux[0].pincmd = local_d8._4_4_;
              meta_00.pinmap = (undefined4)uStack_e0;
              meta_00.parent_id = uStack_e0._4_4_;
              meta_00.mux[0].pin = (undefined4)uStack_d0;
              meta_00.mux[0].value = uStack_d0._4_4_;
              meta_00.mux[1].pincmd = (undefined4)local_c8;
              meta_00.mux[1].pin = local_c8._4_4_;
              meta_00.mux[1].value = (undefined4)uStack_c0;
              meta_00.mux[2].pincmd = uStack_c0._4_4_;
              meta_00.mux[2].pin = (undefined4)local_b8;
              meta_00.mux[2].value = local_b8._4_4_;
              meta_00.mux[3].pincmd = (undefined4)uStack_b0;
              meta_00.mux[3].pin = uStack_b0._4_4_;
              meta_00.mux[3].value = (undefined4)local_a8;
              meta_00.mux[4].pincmd = local_a8._4_4_;
              meta_00.mux[4].pin = (undefined4)uStack_a0;
              meta_00.mux[4].value = uStack_a0._4_4_;
              meta_00.mux[5].pincmd = (undefined4)local_98;
              meta_00.mux[5].pin = local_98._4_4_;
              meta_00.mux[5].value = (undefined4)uStack_90;
              meta_00.output_enable = uStack_90._4_4_;
              meta_00.complex_cap = (mraa_pin_cap_complex_t)local_88;
              meta_00.gpio_chip = (int)in_stack_fffffffffffffefc;
              meta_00.gpio_line = (int)((ulong)in_stack_fffffffffffffefc >> 0x20);
              mVar2 = mraa_setup_mux_mapped(meta_00);
              if (mVar2 != MRAA_SUCCESS) {
                syslog(3,"uart%i: init: failed to setup muxes for TX pin",(ulong)local_14);
                return (mraa_uart_context)0x0;
              }
            }
          }
          _pos = mraa_uart_init_raw(plat->uart_dev[(int)local_14].device_path);
          if (_pos == (mraa_uart_context)0x0) {
            _pos = (mraa_uart_context)0x0;
          }
          else {
            _pos->index = local_14;
            if ((((_pos != (mraa_uart_context)0x0) && (_pos->advance_func != (mraa_adv_func_t *)0x0)
                 ) && (_pos->advance_func->uart_init_post !=
                       (_func_mraa_result_t_mraa_uart_context *)0x0)) &&
               (mVar2 = (*_pos->advance_func->uart_init_post)(_pos), mVar2 != MRAA_SUCCESS)) {
              free(_pos);
              _pos = (mraa_uart_context)0x0;
            }
          }
        }
        else {
          syslog(3,"uart%i: init: platform has only %i uarts",(ulong)local_14,
                 (ulong)(uint)plat->uart_dev_count);
          _pos = (mraa_uart_context)0x0;
        }
      }
      else {
        syslog(3,"uart%i: init: failure in pre-init platform hook",(ulong)local_14);
        _pos = (mraa_uart_context)0x0;
      }
    }
    else {
      syslog(5,"uart%i: init: Using sub platform is not supported",(ulong)local_14);
      _pos = (mraa_uart_context)0x0;
    }
  }
  return _pos;
}

Assistant:

mraa_uart_context
mraa_uart_init(int index)
{
    if (plat == NULL) {
        syslog(LOG_ERR, "uart%i: init: platform not initialised", index);
        return NULL;
    }

    if (mraa_is_sub_platform_id(index)) {
        syslog(LOG_NOTICE, "uart%i: init: Using sub platform is not supported", index);
        return NULL;
    }

    if (plat->adv_func != NULL && plat->adv_func->uart_init_pre != NULL) {
        if (plat->adv_func->uart_init_pre(index) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "uart%i: init: failure in pre-init platform hook", index);
            return NULL;
        }
    }

    if (plat->uart_dev_count == 0) {
        syslog(LOG_ERR, "uart%i: init: platform has no UARTs defined", index);
        return NULL;
    }

    if (plat->uart_dev_count <= index) {
        syslog(LOG_ERR, "uart%i: init: platform has only %i uarts", index, plat->uart_dev_count);
        return NULL;
    }

    if (!plat->no_bus_mux) {
        int pos = plat->uart_dev[index].rx;
        if (pos >= 0) {
            if (plat->pins[pos].uart.mux_total > 0) {
                if (mraa_setup_mux_mapped(plat->pins[pos].uart) != MRAA_SUCCESS) {
                    syslog(LOG_ERR, "uart%i: init: failed to setup muxes for RX pin", index);
                    return NULL;
                }
            }
        }

        pos = plat->uart_dev[index].tx;
        if (pos >= 0) {
            if (plat->pins[pos].uart.mux_total > 0) {
                if (mraa_setup_mux_mapped(plat->pins[pos].uart) != MRAA_SUCCESS) {
                    syslog(LOG_ERR, "uart%i: init: failed to setup muxes for TX pin", index);
                    return NULL;
                }
            }
        }
    }

    mraa_uart_context dev = mraa_uart_init_raw((char*)plat->uart_dev[index].device_path);
    if (dev == NULL) {
        return NULL;
    }
    dev->index = index; //Set the board Index.

    if (IS_FUNC_DEFINED(dev, uart_init_post)) {
        mraa_result_t ret = dev->advance_func->uart_init_post(dev);
        if (ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    return dev;
}